

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line.h
# Opt level: O3

void __thiscall kiste::line_data_t::line_data_t(line_data_t *this,class_t *data)

{
  pointer pcVar1;
  
  this->_type = class_begin;
  (this->_segments).super__Vector_base<kiste::segment_t,_std::allocator<kiste::segment_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_segments).super__Vector_base<kiste::segment_t,_std::allocator<kiste::segment_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_segments).super__Vector_base<kiste::segment_t,_std::allocator<kiste::segment_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_class_data)._name._M_dataplus._M_p = (pointer)&(this->_class_data)._name.field_2;
  pcVar1 = (data->_name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_class_data,pcVar1,pcVar1 + (data->_name)._M_string_length);
  (this->_class_data)._parent_name._M_dataplus._M_p =
       (pointer)&(this->_class_data)._parent_name.field_2;
  pcVar1 = (data->_parent_name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->_class_data)._parent_name,pcVar1,
             pcVar1 + (data->_parent_name)._M_string_length);
  (this->_member).class_name._M_dataplus._M_p = (pointer)&(this->_member).class_name.field_2;
  (this->_member).class_name._M_string_length = 0;
  (this->_member).class_name.field_2._M_local_buf[0] = '\0';
  (this->_member).name._M_dataplus._M_p = (pointer)&(this->_member).name.field_2;
  (this->_member).name._M_string_length = 0;
  (this->_member).name.field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

line_data_t(const class_t& data) : _type(line_type::class_begin), _class_data(data)
    {
    }